

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# views_pool.h
# Opt level: O0

void __thiscall
cppcms::views::generator::add_view<tc_skin::view_y,data::master>
          (generator *this,string *view_name,bool safe)

{
  _func_unique_ptr_ostream_ptr_base_content_ptr *in_RSI;
  string *in_RDI;
  view_factory_type *factory;
  
  cppcms::views::generator::add_factory(in_RDI,in_RSI);
  return;
}

Assistant:

void add_view(std::string const &view_name,bool safe = true)
			{
				view_factory_type *factory = 0;
				if(safe)
					factory = view_builder<View,Content>;
				else
					factory = unsafe_view_builder<View,Content>;
				add_factory(view_name,factory);
			}